

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.cpp
# Opt level: O3

void scale(Runtime *rt)

{
  int iVar1;
  pointer pdVar2;
  int iVar3;
  mapped_type_conflict1 *pmVar4;
  pointer piVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> factorpervar;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> maxabscoefpervar;
  key_type_conflict1 local_bc;
  double local_b8;
  undefined8 uStack_b0;
  int local_9c;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_98;
  double local_68;
  undefined8 uStack_60;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_58;
  
  Instance::operator=(&rt->scaled,&rt->instance);
  scale_rows(rt);
  if ((rt->settings).varscaling != true) goto LAB_00338ffe;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl._0_4_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((rt->scaled).num_var < 1) {
LAB_00338fcd:
    local_98._M_impl._0_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    do {
      pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,(key_type_conflict1 *)&local_98);
      *pmVar4 = 0.0;
      local_98._M_impl._0_4_ = local_98._M_impl._0_4_ + 1;
      iVar3 = (rt->scaled).num_var;
    } while ((int)local_98._M_impl._0_4_ < iVar3);
    local_98._M_impl._0_4_ = 0;
    if (iVar3 < 1) goto LAB_00338fcd;
    do {
      lVar6 = (long)(int)local_98._M_impl._0_4_;
      piVar5 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = piVar5[lVar6];
      lVar7 = (long)iVar3;
      if (iVar3 < piVar5[lVar6 + 1]) {
        do {
          local_b8 = (rt->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar7];
          uStack_b0 = 0;
          pmVar4 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)&local_58,(key_type_conflict1 *)&local_98);
          if (*pmVar4 <= ABS(local_b8) && ABS(local_b8) != *pmVar4) {
            local_b8 = (rt->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar7];
            uStack_b0 = 0;
            pmVar4 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                   *)&local_58,(key_type_conflict1 *)&local_98);
            *pmVar4 = ABS(local_b8);
          }
          lVar7 = lVar7 + 1;
          lVar6 = (long)(int)local_98._M_impl._0_4_;
        } while (lVar7 < (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar6 + 1]);
      }
      piVar5 = (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)piVar5[lVar6];
      iVar3 = local_98._M_impl._0_4_;
      if (piVar5[lVar6] < piVar5[(long)(int)local_98._M_impl._0_4_ + 1]) {
        do {
          if ((rt->scaled).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] == iVar3) {
            pmVar4 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                   *)&local_58,(key_type_conflict1 *)&local_98);
            local_b8 = *pmVar4;
            local_68 = (rt->scaled).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar7];
            uStack_60 = 0;
            pmVar4 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                   *)&local_58,(key_type_conflict1 *)&local_98);
            dVar8 = SQRT(ABS(local_68));
            dVar9 = dVar8;
            if (dVar8 <= local_b8) {
              dVar9 = local_b8;
            }
            *pmVar4 = (mapped_type_conflict1)
                      (~-(ulong)NAN(local_b8) & (ulong)dVar9 | -(ulong)NAN(local_b8) & (ulong)dVar8)
            ;
            piVar5 = (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar3 = local_98._M_impl._0_4_;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < piVar5[(long)iVar3 + 1]);
      }
      local_98._M_impl._0_4_ = iVar3 + 1;
      iVar3 = (rt->scaled).num_var;
    } while ((int)local_98._M_impl._0_4_ < iVar3);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_bc = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < iVar3) {
      do {
        pmVar4 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_58,&local_bc);
        log2(*pmVar4);
        pmVar4 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_98,&local_bc);
        *pmVar4 = 1.0;
        local_bc = local_bc + 1;
        iVar3 = (rt->scaled).num_var;
      } while (local_bc < iVar3);
      local_bc = 0;
      if (0 < iVar3) {
        do {
          pmVar4 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)&local_98,&local_bc);
          dVar9 = *pmVar4;
          lVar6 = (long)local_bc;
          piVar5 = (rt->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = piVar5[lVar6];
          lVar7 = (long)iVar3;
          iVar1 = piVar5[lVar6 + 1];
          if (iVar3 < iVar1) {
            pdVar2 = (rt->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              pdVar2[lVar7] = pdVar2[lVar7] / dVar9;
              lVar7 = lVar7 + 1;
            } while (iVar1 != lVar7);
          }
          local_bc = local_bc + 1;
          pdVar2 = (rt->scaled).c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2[lVar6] = pdVar2[lVar6] / dVar9;
          iVar3 = (rt->scaled).num_var;
        } while (local_bc < iVar3);
        local_bc = 0;
        if (0 < iVar3) {
          do {
            pmVar4 = std::
                     map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                   *)&local_98,&local_bc);
            piVar5 = (rt->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar3 = piVar5[local_bc];
            lVar6 = (long)iVar3;
            if (iVar3 < piVar5[(long)local_bc + 1]) {
              local_b8 = *pmVar4;
              do {
                local_9c = (rt->scaled).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar6];
                pmVar4 = std::
                         map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                       *)&local_98,&local_9c);
                pdVar2 = (rt->scaled).Q.mat.value.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar2[lVar6] = pdVar2[lVar6] / (*pmVar4 * local_b8);
                lVar6 = lVar6 + 1;
              } while (lVar6 < (rt->scaled).Q.mat.start.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[(long)local_bc + 1]);
            }
            local_bc = local_bc + 1;
          } while (local_bc < (rt->scaled).num_var);
        }
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_58);
LAB_00338ffe:
  scale_rows(rt);
  return;
}

Assistant:

void scale(Runtime& rt) {
  rt.scaled = rt.instance;
  scale_rows(rt);
  scale_cols(rt);
  scale_rows(rt);
}